

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_check_serverhello_tlsext(SSL_HANDSHAKE *hs)

{
  Span<const_unsigned_char> in;
  bool bVar1;
  pointer psVar2;
  size_t in_R8;
  Span<const_unsigned_char> protocol;
  Span<const_unsigned_char> *local_40;
  uchar *local_38;
  undefined1 local_30 [8];
  Span<const_unsigned_char> settings;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  settings.size_ = (size_t)hs->ssl;
  bVar1 = std::operator!=(&hs->new_session,(nullptr_t)0x0);
  if ((bVar1) &&
     (psVar2 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->
                         (&hs->new_session), ((byte)psVar2->field_0x1b8 >> 6 & 1) != 0)) {
    bVar1 = Array<unsigned_char>::empty
                      ((Array<unsigned_char> *)(*(long *)(settings.size_ + 0x30) + 0x218));
    if (bVar1) {
      ERR_put_error(0x10,0,0x134,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x1070);
      ssl_send_alert((SSL *)settings.size_,2,0x2f);
      return false;
    }
    Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)local_30);
    Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_40,
               (Array<unsigned_char> *)(*(long *)(settings.size_ + 0x30) + 0x218));
    protocol.size_ = in_R8;
    protocol.data_ = local_38;
    bVar1 = ssl_get_local_application_settings
                      ((bssl *)hs,(SSL_HANDSHAKE *)local_30,local_40,protocol);
    if (!bVar1) {
      ERR_put_error(0x10,0,0x103,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,0x1079);
      ssl_send_alert((SSL *)settings.size_,2,0x2f);
      return false;
    }
    psVar2 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::operator->(&hs->new_session);
    in.size_ = (size_t)settings.data_;
    in.data_ = (uchar *)local_30;
    bVar1 = Array<unsigned_char>::CopyFrom(&psVar2->local_application_settings,in);
    if (!bVar1) {
      ssl_send_alert((SSL *)settings.size_,2,0x50);
      return false;
    }
  }
  return true;
}

Assistant:

static bool ssl_check_serverhello_tlsext(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  // ALPS and ALPN have a dependency between each other, so we defer checking
  // consistency to after the callbacks run.
  if (hs->new_session != nullptr && hs->new_session->has_application_settings) {
    // ALPN must be negotiated.
    if (ssl->s3->alpn_selected.empty()) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_NEGOTIATED_ALPS_WITHOUT_ALPN);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
      return false;
    }

    // The negotiated protocol must be one of the ones we advertised for ALPS.
    Span<const uint8_t> settings;
    if (!ssl_get_local_application_settings(hs, &settings,
                                            ssl->s3->alpn_selected)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_ALPN_PROTOCOL);
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
      return false;
    }

    if (!hs->new_session->local_application_settings.CopyFrom(settings)) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
      return false;
    }
  }

  return true;
}